

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosYAML.cpp
# Opt level: O0

void adios2::helper::(anonymous_namespace)::SetOption<std::__cxx11::string>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,
               string *nodeName,Node *upperNode,string *hint,bool mandatory)

{
  bool bVar1;
  string *in_RSI;
  string *in_RDI;
  byte in_R8B;
  Node node;
  value in_stack_00000160;
  bool in_stack_00000167;
  string *in_stack_00000168;
  Node *in_stack_00000170;
  string *in_stack_00000178;
  Node *this;
  string local_b8 [32];
  Node *in_stack_ffffffffffffff68;
  Node local_88;
  byte local_21;
  string *local_8;
  
  local_21 = in_R8B & 1;
  this = &local_88;
  local_8 = in_RDI;
  std::__cxx11::string::string((string *)this,in_RSI);
  anon_unknown_0::YAMLNode
            (in_stack_00000178,in_stack_00000170,in_stack_00000168,in_stack_00000167,
             in_stack_00000160);
  std::__cxx11::string::~string((string *)&local_88);
  bVar1 = YAML::Node::operator_cast_to_bool((Node *)0x9d9e2a);
  if (bVar1) {
    YAML::Node::as<std::__cxx11::string>(in_stack_ffffffffffffff68);
    std::__cxx11::string::operator=(local_8,local_b8);
    std::__cxx11::string::~string(local_b8);
  }
  YAML::Node::~Node(this);
  return;
}

Assistant:

void SetOption(T &value, const std::string nodeName, const YAML::Node &upperNode,
               const std::string &hint, bool mandatory = isNotMandatory)
{
    auto node = YAMLNode(nodeName, upperNode, hint, mandatory, YAML::NodeType::Scalar);
    if (node)
    {
        value = node.as<T>();
    }
}